

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageInputsXrEnableUserCalibrationEventsML
                   (XrInstance instance,XrUserCalibrationEnableEventsInfoML *enableInfo)

{
  ValidateXrHandleResult VVar1;
  GenValidUsageXrInstanceInfo *pGVar2;
  allocator local_3c9;
  string local_3c8 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_3a8;
  allocator local_389;
  string local_388 [39];
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [39];
  allocator local_311;
  string local_310 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_2f0;
  allocator local_2d1;
  string local_2d0 [39];
  allocator local_2a9;
  string local_2a8 [32];
  GenValidUsageXrInstanceInfo *local_288;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  string local_278 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_258;
  allocator local_239;
  string local_238 [39];
  allocator local_211;
  string local_210 [32];
  XrInstance_T local_1f0 [32];
  ostringstream local_1d0 [8];
  ostringstream oss;
  ValidateXrHandleResult handle_result;
  XrObjectType local_44;
  undefined1 local_40 [8];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  XrResult xr_result;
  XrUserCalibrationEnableEventsInfoML *enableInfo_local;
  XrInstance instance_local;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  enableInfo_local = (XrUserCalibrationEnableEventsInfoML *)instance;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_40);
  local_44 = XR_OBJECT_TYPE_INSTANCE;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrInstance_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)local_40
             ,(XrInstance_T **)&enableInfo_local,&local_44);
  VVar1 = VerifyXrInstanceHandle((XrInstance *)&enableInfo_local);
  if (VVar1 == VALIDATE_XR_HANDLE_SUCCESS) {
    pGVar2 = HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>::get
                       (&g_instance_info.
                         super_HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>,
                        (XrInstance_T *)enableInfo_local);
    local_288 = pGVar2;
    if (enableInfo == (XrUserCalibrationEnableEventsInfoML *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2a8,"VUID-xrEnableUserCalibrationEventsML-enableInfo-parameter",&local_2a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2d0,"xrEnableUserCalibrationEventsML",&local_2d1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_2f0,
                 (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 local_40);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_310,
                 "Invalid NULL for XrUserCalibrationEnableEventsInfoML \"enableInfo\" which is not optional and must be non-NULL"
                 ,&local_311);
      CoreValidLogMessage(pGVar2,(string *)local_2a8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          (string *)local_2d0,&local_2f0,(string *)local_310);
      std::__cxx11::string::~string(local_310);
      std::allocator<char>::~allocator((allocator<char> *)&local_311);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_2f0);
      std::__cxx11::string::~string(local_2d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
      std::__cxx11::string::~string(local_2a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
      instance_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      gen_instance_info._4_4_ = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_338,"xrEnableUserCalibrationEventsML",&local_339);
      objects_info.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           ValidateXrStruct(pGVar2,(string *)local_338,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)local_40,true,true,enableInfo);
      std::__cxx11::string::~string(local_338);
      std::allocator<char>::~allocator((allocator<char> *)&local_339);
      pGVar2 = local_288;
      if (objects_info.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS) {
        instance_local._4_4_ =
             objects_info.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        gen_instance_info._4_4_ = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_360,"VUID-xrEnableUserCalibrationEventsML-enableInfo-parameter",&local_361)
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_388,"xrEnableUserCalibrationEventsML",&local_389);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_3a8,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_40);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_3c8,"Command xrEnableUserCalibrationEventsML param enableInfo is invalid",
                   &local_3c9);
        CoreValidLogMessage(pGVar2,(string *)local_360,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            (string *)local_388,&local_3a8,(string *)local_3c8);
        std::__cxx11::string::~string(local_3c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_3a8);
        std::__cxx11::string::~string(local_388);
        std::allocator<char>::~allocator((allocator<char> *)&local_389);
        std::__cxx11::string::~string(local_360);
        std::allocator<char>::~allocator((allocator<char> *)&local_361);
        instance_local._4_4_ =
             objects_info.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        gen_instance_info._4_4_ = 1;
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1d0);
    std::operator<<((ostream *)local_1d0,"Invalid XrInstance handle \"instance\" ");
    HandleToHexString<XrInstance_T*>(local_1f0);
    std::operator<<((ostream *)local_1d0,(string *)local_1f0);
    std::__cxx11::string::~string((string *)local_1f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_210,"VUID-xrEnableUserCalibrationEventsML-instance-parameter",&local_211);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_238,"xrEnableUserCalibrationEventsML",&local_239);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_258,
               (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               local_40);
    std::__cxx11::ostringstream::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,(string *)local_210,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)local_238,&local_258,local_278);
    std::__cxx11::string::~string((string *)local_278);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_258);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
    std::__cxx11::string::~string(local_210);
    std::allocator<char>::~allocator((allocator<char> *)&local_211);
    instance_local._4_4_ = XR_ERROR_HANDLE_INVALID;
    gen_instance_info._4_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1d0);
  }
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_40);
  return instance_local._4_4_;
}

Assistant:

XrResult GenValidUsageInputsXrEnableUserCalibrationEventsML(
XrInstance instance,
const XrUserCalibrationEnableEventsInfoML* enableInfo) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(instance, XR_OBJECT_TYPE_INSTANCE);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrInstanceHandle(&instance);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrInstance handle \"instance\" ";
                oss << HandleToHexString(instance);
                CoreValidLogMessage(nullptr, "VUID-xrEnableUserCalibrationEventsML-instance-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnableUserCalibrationEventsML",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        GenValidUsageXrInstanceInfo *gen_instance_info = g_instance_info.get(instance);
        (void)gen_instance_info;  // quiet warnings
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == enableInfo) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrEnableUserCalibrationEventsML-enableInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnableUserCalibrationEventsML", objects_info,
                                "Invalid NULL for XrUserCalibrationEnableEventsInfoML \"enableInfo\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrUserCalibrationEnableEventsInfoML is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrEnableUserCalibrationEventsML", objects_info,
                                                        true, true, enableInfo);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrEnableUserCalibrationEventsML-enableInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnableUserCalibrationEventsML",
                                objects_info,
                                "Command xrEnableUserCalibrationEventsML param enableInfo is invalid");
            return xr_result;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}